

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.c
# Opt level: O3

Integer pnga_type_f2c(Integer type)

{
  if ((type - 0x3f2U < 6) && ((0x3dU >> ((uint)(type - 0x3f2U) & 0x1f) & 1) != 0)) {
    type = *(Integer *)(type * 8 + 0x1b2e40);
  }
  return type;
}

Assistant:

Integer pnga_type_f2c(Integer type)
{
Integer ctype;
   switch(type){
   case MT_F_INT: 
#       if   SIZEOF_F77_INTEGER == SIZEOF_INT
                ctype = C_INT;
#       elif SIZEOF_F77_INTEGER == SIZEOF_LONG
                ctype = C_LONG;
#       elif SIZEOF_F77_INTEGER == SIZEOF_LONG_LONG
                ctype = C_LONGLONG;
#       else
#           error SIZEOF_F77_INTEGER == SIZEOF_???
#       endif
                break;
   case MT_F_REAL: 
#       if   SIZEOF_F77_REAL == SIZEOF_FLOAT
                ctype = C_FLOAT;
#       elif SIZEOF_F77_REAL == SIZEOF_DOUBLE
                ctype = C_DBL;
#       elif SIZEOF_F77_REAL == SIZEOF_LONG_DOUBLE
#           error SIZEOF_F77_REAL == SIZEOF_LONG_DOUBLE not supported?
#       else
#           error SIZEOF_F77_REAL == SIZEOF_???
#       endif
                break;
   case MT_F_DBL: 
#       if   SIZEOF_F77_DOUBLE_PRECISION == SIZEOF_DOUBLE
                ctype = C_DBL;
#       elif SIZEOF_F77_DOUBLE_PRECISION == SIZEOF_LONG_DOUBLE
#           error SIZEOF_F77_DOUBLE_PRECISION == SIZEOF_LONG_DOUBLE not supported?
#       else
#           error SIZEOF_F77_DOUBLE_PRECISION == SIZEOF_???
#       endif
                break;
   case MT_F_DCPL: 
		ctype = C_DCPL;
                break;
   case MT_F_SCPL: 
#       if   SIZEOF_F77_REAL == SIZEOF_FLOAT
                ctype = C_SCPL;
#       elif SIZEOF_F77_REAL == SIZEOF_DOUBLE
                ctype = C_DCPL;
#       elif SIZEOF_F77_REAL == SIZEOF_LONG_DOUBLE
#           error SIZEOF_F77_REAL == SIZEOF_LONG_DOUBLE not supported?
#       else
#           error SIZEOF_F77_REAL == SIZEOF_???
#       endif
                break;
   default:     ctype = type;
                break;
   }
   
   return(ctype);
}